

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001c7e60 = 0x2e2e2e2e2e2e2e;
    uRam00000000001c7e67._0_1_ = '.';
    uRam00000000001c7e67._1_1_ = '.';
    uRam00000000001c7e67._2_1_ = '.';
    uRam00000000001c7e67._3_1_ = '.';
    uRam00000000001c7e67._4_1_ = '.';
    uRam00000000001c7e67._5_1_ = '.';
    uRam00000000001c7e67._6_1_ = '.';
    uRam00000000001c7e67._7_1_ = '.';
    DAT_001c7e50 = '.';
    DAT_001c7e50_1._0_1_ = '.';
    DAT_001c7e50_1._1_1_ = '.';
    DAT_001c7e50_1._2_1_ = '.';
    DAT_001c7e50_1._3_1_ = '.';
    DAT_001c7e50_1._4_1_ = '.';
    DAT_001c7e50_1._5_1_ = '.';
    DAT_001c7e50_1._6_1_ = '.';
    uRam00000000001c7e58 = 0x2e2e2e2e2e2e2e;
    DAT_001c7e5f = 0x2e;
    DAT_001c7e40 = '.';
    DAT_001c7e40_1._0_1_ = '.';
    DAT_001c7e40_1._1_1_ = '.';
    DAT_001c7e40_1._2_1_ = '.';
    DAT_001c7e40_1._3_1_ = '.';
    DAT_001c7e40_1._4_1_ = '.';
    DAT_001c7e40_1._5_1_ = '.';
    DAT_001c7e40_1._6_1_ = '.';
    uRam00000000001c7e48._0_1_ = '.';
    uRam00000000001c7e48._1_1_ = '.';
    uRam00000000001c7e48._2_1_ = '.';
    uRam00000000001c7e48._3_1_ = '.';
    uRam00000000001c7e48._4_1_ = '.';
    uRam00000000001c7e48._5_1_ = '.';
    uRam00000000001c7e48._6_1_ = '.';
    uRam00000000001c7e48._7_1_ = '.';
    DAT_001c7e30 = '.';
    DAT_001c7e30_1._0_1_ = '.';
    DAT_001c7e30_1._1_1_ = '.';
    DAT_001c7e30_1._2_1_ = '.';
    DAT_001c7e30_1._3_1_ = '.';
    DAT_001c7e30_1._4_1_ = '.';
    DAT_001c7e30_1._5_1_ = '.';
    DAT_001c7e30_1._6_1_ = '.';
    uRam00000000001c7e38._0_1_ = '.';
    uRam00000000001c7e38._1_1_ = '.';
    uRam00000000001c7e38._2_1_ = '.';
    uRam00000000001c7e38._3_1_ = '.';
    uRam00000000001c7e38._4_1_ = '.';
    uRam00000000001c7e38._5_1_ = '.';
    uRam00000000001c7e38._6_1_ = '.';
    uRam00000000001c7e38._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001c7e28._0_1_ = '.';
    uRam00000000001c7e28._1_1_ = '.';
    uRam00000000001c7e28._2_1_ = '.';
    uRam00000000001c7e28._3_1_ = '.';
    uRam00000000001c7e28._4_1_ = '.';
    uRam00000000001c7e28._5_1_ = '.';
    uRam00000000001c7e28._6_1_ = '.';
    uRam00000000001c7e28._7_1_ = '.';
    DAT_001c7e6f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const &_name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
  }